

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O1

char * __thiscall
icu_63::LocalMemory<char>::allocateInsteadAndCopy
          (LocalMemory<char> *this,int32_t newCapacity,int32_t length)

{
  char *__dest;
  
  if (newCapacity < 1) {
    __dest = (char *)0x0;
  }
  else {
    __dest = (char *)uprv_malloc_63((ulong)(uint)newCapacity);
    if (__dest != (char *)0x0) {
      if (0 < length) {
        if (length < newCapacity) {
          newCapacity = length;
        }
        memcpy(__dest,(this->super_LocalPointerBase<char>).ptr,(ulong)(uint)newCapacity);
      }
      uprv_free_63((this->super_LocalPointerBase<char>).ptr);
      (this->super_LocalPointerBase<char>).ptr = __dest;
    }
  }
  return __dest;
}

Assistant:

inline T *LocalMemory<T>::allocateInsteadAndCopy(int32_t newCapacity, int32_t length) {
    if(newCapacity>0) {
        T *p=(T *)uprv_malloc(newCapacity*sizeof(T));
        if(p!=NULL) {
            if(length>0) {
                if(length>newCapacity) {
                    length=newCapacity;
                }
                uprv_memcpy(p, LocalPointerBase<T>::ptr, (size_t)length*sizeof(T));
            }
            uprv_free(LocalPointerBase<T>::ptr);
            LocalPointerBase<T>::ptr=p;
        }
        return p;
    } else {
        return NULL;
    }
}